

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBlitImage::CopyImplementation::recordCopyCommand
          (CopyImplementation *this,VkCommandBuffer cmdBuffer)

{
  DeviceInterface *pDVar1;
  Image *pIVar2;
  ImageResource *pIVar3;
  Image *pIVar4;
  
  pDVar1 = ((this->super_ImplementationBase).m_context)->m_vk;
  pIVar3 = &((this->super_ImplementationBase).m_resource)->m_imageData;
  pIVar2 = (this->super_ImplementationBase).m_image.
           super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
           .m_data.ptr;
  pIVar4 = (Image *)pIVar3;
  if ((this->super_ImplementationBase).m_mode != ACCESS_MODE_READ) {
    pIVar4 = pIVar2;
    pIVar2 = (Image *)pIVar3;
  }
  (*pDVar1->_vptr_DeviceInterface[0x60])
            (pDVar1,cmdBuffer,
             (pIVar4->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,
             (pIVar2->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,7,1,&this->m_imageCopyRegion);
  return;
}

Assistant:

void recordCopyCommand (const VkCommandBuffer cmdBuffer)
	{
		const DeviceInterface&	vk	= m_context.getDeviceInterface();

		if (m_mode == ACCESS_MODE_READ)
		{
			// Resource Image -> Staging image
			vk.cmdCopyImage(cmdBuffer, m_resource.getImage().handle, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **m_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &m_imageCopyRegion);
		}
		else
		{
			// Staging image -> Resource Image
			vk.cmdCopyImage(cmdBuffer, **m_image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, m_resource.getImage().handle, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &m_imageCopyRegion);
		}
	}